

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::BasicReporter::NoAssertionsInSection(BasicReporter *this,string *sectionName)

{
  ostream *poVar1;
  undefined1 local_28 [8];
  TextColour colour;
  string *sectionName_local;
  BasicReporter *this_local;
  
  colour.m_impl = (ConsoleColourImpl *)sectionName;
  startSpansLazily(this);
  TextColour::TextColour((TextColour *)local_28,ResultError);
  poVar1 = std::operator<<((this->m_config).stream,"\nNo assertions in section, \'");
  poVar1 = std::operator<<(poVar1,(string *)colour.m_impl);
  poVar1 = std::operator<<(poVar1,"\'\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  TextColour::~TextColour((TextColour *)local_28);
  return;
}

Assistant:

virtual void NoAssertionsInSection( const std::string& sectionName ) {
            startSpansLazily();
            TextColour colour( TextColour::ResultError );
            m_config.stream << "\nNo assertions in section, '" << sectionName << "'\n" << std::endl;
        }